

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxPrinter.cpp
# Opt level: O1

SyntaxPrinter * __thiscall slang::syntax::SyntaxPrinter::print(SyntaxPrinter *this,Trivia trivia)

{
  Token *pTVar1;
  SyntaxNode *pSVar2;
  Trivia *pTVar3;
  undefined8 uVar4;
  Trivia *t;
  Token *pTVar5;
  Trivia *pTVar6;
  string_view text;
  span<const_slang::parsing::Token,_18446744073709551615UL> sVar7;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar8;
  anon_union_12_4_39e54f29_for_Trivia_0 local_38;
  TriviaKind TStack_2b;
  Token local_28;
  
  uVar4 = trivia._8_8_;
  local_38.rawText.ptr = (char *)trivia.field_0._0_8_;
  TStack_2b = trivia.kind;
  unique0x1000019e = uVar4;
  switch(TStack_2b) {
  case LineComment:
  case BlockComment:
    if (this->includeComments != true) {
      return this;
    }
  default:
    text = parsing::Trivia::getRawText((Trivia *)&local_38);
    append(this,text);
    return this;
  case SkippedTokens:
    if (this->includeSkipped != true) {
      return this;
    }
    sVar7 = parsing::Trivia::getSkippedTokens((Trivia *)&local_38);
    pTVar1 = sVar7.data_;
    if (sVar7.size_ != 0) {
      pTVar5 = pTVar1 + sVar7.size_;
      do {
        print(this,*pTVar1);
        pTVar1 = pTVar1 + 1;
      } while (pTVar1 != pTVar5);
      return this;
    }
    return this;
  case SkippedSyntax:
    if (this->includeSkipped != true) {
      return this;
    }
    break;
  case Directive:
    if (this->includeDirectives != true) {
      if (this->includePreprocessed != true) {
        return this;
      }
      pSVar2 = parsing::Trivia::syntax((Trivia *)&local_38);
      local_28 = SyntaxNode::getFirstToken(pSVar2);
      sVar8 = parsing::Token::trivia(&local_28);
      pTVar3 = sVar8.data_;
      if (sVar8.size_ != 0) {
        pTVar6 = pTVar3 + sVar8.size_;
        do {
          print(this,*pTVar3);
          pTVar3 = pTVar3 + 1;
        } while (pTVar3 != pTVar6);
        return this;
      }
      return this;
    }
  }
  pSVar2 = parsing::Trivia::syntax((Trivia *)&local_38);
  print(this,pSVar2);
  return this;
}

Assistant:

SyntaxPrinter& SyntaxPrinter::print(Trivia trivia) {
    switch (trivia.kind) {
        case TriviaKind::Directive:
            if (includeDirectives)
                print(*trivia.syntax());
            else if (includePreprocessed) {
                for (const auto& t : trivia.syntax()->getFirstToken().trivia())
                    print(t);
            }
            break;
        case TriviaKind::SkippedSyntax:
            if (includeSkipped)
                print(*trivia.syntax());
            break;
        case TriviaKind::SkippedTokens:
            if (includeSkipped) {
                for (Token t : trivia.getSkippedTokens())
                    print(t);
            }
            break;
        case TriviaKind::LineComment:
        case TriviaKind::BlockComment:
            if (!includeComments)
                break;
            [[fallthrough]];
        default:
            append(trivia.getRawText());
            break;
    }
    return *this;
}